

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<solitaire::colliders::TableauPileColliderCollidedCardTests>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppPVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> *pPVar5;
  pointer ppPVar6;
  CodeLocation local_80;
  ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests> *local_58;
  CodeLocation local_50;
  
  ppPVar6 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppPVar6 == ppPVar2) {
LAB_001bc7d0:
      pPVar5 = (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>
                *)operator_new(0x80);
      paVar1 = &local_80.file.field_2;
      pcVar3 = (code_location->file)._M_dataplus._M_p;
      local_80.file._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + (code_location->file)._M_string_length);
      local_80.line = code_location->line;
      ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>::
      ParameterizedTestSuiteInfo(pPVar5,test_suite_name,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.file._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.file._M_dataplus._M_p,
                        local_80.file.field_2._M_allocated_capacity + 1);
      }
      local_58 = pPVar5;
      std::
      vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
      ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
                ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                  *)this,(ParameterizedTestSuiteInfoBase **)&local_58);
      return pPVar5;
    }
    iVar4 = (*(*ppPVar6)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar4));
    if (iVar4 == 0) {
      iVar4 = (*(*ppPVar6)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      if ((undefined1 *)CONCAT44(extraout_var_00,iVar4) !=
          &TypeIdHelper<solitaire::colliders::TableauPileColliderCollidedCardTests>::dummy_) {
        local_50.file._M_dataplus._M_p = (pointer)&local_50.file.field_2;
        pcVar3 = (code_location->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + (code_location->file)._M_string_length);
        local_50.line = code_location->line;
        ReportInvalidTestSuiteType(test_suite_name,&local_50);
        CodeLocation::~CodeLocation(&local_50);
        posix::Abort();
      }
      pPVar5 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>,testing::internal::ParameterizedTestSuiteInfoBase>
                         (*ppPVar6);
      if (pPVar5 != (ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollidedCardTests>
                     *)0x0) {
        return pPVar5;
      }
      goto LAB_001bc7d0;
    }
    ppPVar6 = ppPVar6 + 1;
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite> >(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }